

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cc
# Opt level: O1

void cnn::Initialize(int *argc,char ***argv,uint random_seed,bool shared_parameters)

{
  int iVar1;
  long lVar2;
  Device_CPU *this;
  ostream *poVar3;
  undefined7 in_register_00000009;
  undefined8 uVar4;
  ulong uVar5;
  byte bVar6;
  int argi;
  unsigned_long num_mb;
  string a2;
  string arg;
  istringstream c;
  uint local_1410;
  int local_140c;
  undefined8 local_1408;
  undefined4 local_13fc;
  undefined1 *local_13f8 [2];
  undefined1 local_13e8 [16];
  char *local_13d8;
  long local_13d0;
  char local_13c8 [16];
  undefined1 local_13b8 [5000];
  
  uVar4 = CONCAT71(in_register_00000009,shared_parameters);
  local_13fc = (undefined4)uVar4;
  local_1408 = 0x200;
  local_140c = 1;
  if (1 < *argc) {
    do {
      std::__cxx11::string::string((string *)&local_13d8,(*argv)[1],(allocator *)local_13b8);
      iVar1 = std::__cxx11::string::compare((char *)&local_13d8);
      if (iVar1 == 0) {
LAB_001a9fd5:
        if (*argc < 2) {
          std::operator<<((ostream *)&std::cerr,
                          "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n"
                         );
LAB_001aa2b7:
          abort();
        }
        std::__cxx11::string::string((string *)local_13f8,(*argv)[2],(allocator *)local_13b8);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_13b8,(string *)local_13f8,_S_in);
        std::istream::_M_extract<unsigned_long>((ulong *)local_13b8);
LAB_001aa049:
        RemoveArgs(argc,argv,&local_140c,(int)uVar4);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_13b8);
        std::ios_base::~ios_base((ios_base *)(local_13b8 + 0x78));
        if (local_13f8[0] != local_13e8) {
          operator_delete(local_13f8[0]);
        }
        bVar6 = 1;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_13d8);
        if (iVar1 == 0) goto LAB_001a9fd5;
        iVar1 = std::__cxx11::string::compare((char *)&local_13d8);
        if (iVar1 == 0) {
LAB_001aa010:
          if (*argc < 2) {
            std::operator<<((ostream *)&std::cerr,
                            "[cnn] --cnn-seed expects an argument (the random number seed)\n");
            goto LAB_001aa2b7;
          }
          std::__cxx11::string::string((string *)local_13f8,(*argv)[2],(allocator *)local_13b8);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_13b8,(string *)local_13f8,_S_in);
          std::istream::_M_extract<unsigned_int>((uint *)local_13b8);
          goto LAB_001aa049;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_13d8);
        if (iVar1 == 0) goto LAB_001aa010;
        bVar6 = 0;
        uVar4 = 5;
        lVar2 = std::__cxx11::string::find((char *)&local_13d8,0x28318e,0);
        if (lVar2 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[cnn] Bad command line argument: ",0x21);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_13d8,local_13d0);
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_001aa2b7;
        }
      }
      if (local_13d8 != local_13c8) {
        operator_delete(local_13d8);
      }
    } while ((bool)(bVar6 & 1 < *argc));
  }
  local_1410 = random_seed;
  if (random_seed == 0) {
    std::random_device::random_device((random_device *)local_13b8);
    local_1410 = std::random_device::_M_getval();
    std::random_device::_M_fini();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[cnn] random seed: ",0x13);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  rndeng = (ulong *)operator_new(5000);
  uVar5 = (ulong)local_1410;
  *rndeng = uVar5;
  lVar2 = 1;
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar2);
    rndeng[lVar2] = uVar5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  rndeng[0x270] = 0x270;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[cnn] allocating memory: ",0x19);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"MB\n",3);
  this = (Device_CPU *)operator_new(0x80);
  Device_CPU::Device_CPU(this,(int)local_1408,local_13fc._0_1_);
  local_13b8._0_8_ = this;
  if (_DAT_00307cb8 == _DAT_00307cc0) {
    std::vector<cnn::Device*,std::allocator<cnn::Device*>>::_M_realloc_insert<cnn::Device*>
              ((vector<cnn::Device*,std::allocator<cnn::Device*>> *)&devices,_DAT_00307cb8,
               (Device **)local_13b8);
  }
  else {
    *_DAT_00307cb8 = (Device *)this;
    _DAT_00307cb8 = _DAT_00307cb8 + 1;
  }
  default_device = *devices;
  fxs = *(undefined8 *)(default_device + 0x18);
  dEdfs = *(undefined8 *)(default_device + 0x20);
  ps = *(undefined8 *)(default_device + 0x28);
  kSCALAR_MINUSONE = *(undefined8 *)(default_device + 0x30);
  kSCALAR_ONE = *(undefined8 *)(default_device + 0x38);
  kSCALAR_ZERO = *(undefined8 *)(default_device + 0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[cnn] memory allocation done.\n",0x1e);
  return;
}

Assistant:

void Initialize(int& argc, char**& argv, unsigned random_seed, bool shared_parameters) {
  vector<Device*> gpudevices;
#if HAVE_CUDA
  cerr << "[cnn] initializing CUDA\n";
  gpudevices = Initialize_GPU(argc, argv);
#endif
  unsigned long num_mb = 512UL;
  int argi = 1;
  while(argi < argc) {
    string arg = argv[argi];
    if (arg == "--cnn-mem" || arg == "--cnn_mem") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> num_mb;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg == "--cnn-seed" || arg == "--cnn_seed") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-seed expects an argument (the random number seed)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> random_seed;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg.find("--cnn") == 0) {
      cerr << "[cnn] Bad command line argument: " << arg << endl;
      abort();
    } else { break; }
  }
  if (random_seed == 0) {
    random_device rd;
    random_seed = rd();
  }
  cerr << "[cnn] random seed: " << random_seed << endl;
  rndeng = new mt19937(random_seed);

  cerr << "[cnn] allocating memory: " << num_mb << "MB\n";
  devices.push_back(new Device_CPU(num_mb, shared_parameters));
  int default_index = 0;
  if (gpudevices.size() > 0) {
    for (auto gpu : gpudevices)
      devices.push_back(gpu);
    default_index++;
  }
  default_device = devices[default_index];

  // TODO these should be accessed through the relevant device and removed here
  fxs = default_device->fxs;
  dEdfs = default_device->dEdfs;
  ps = default_device->ps;
  kSCALAR_MINUSONE = default_device->kSCALAR_MINUSONE;
  kSCALAR_ONE = default_device->kSCALAR_ONE;
  kSCALAR_ZERO = default_device->kSCALAR_ZERO;
  cerr << "[cnn] memory allocation done.\n";
}